

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::ChHexahedronFace::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChHexahedronFace *this,double U,double V)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  ChVector<double> *v;
  int i;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ChLoadableUV local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  i = (int)this;
  GetNodeN((ChHexahedronFace *)&local_28,i);
  dVar9 = *(double *)((long)local_28 + 0x20);
  dVar17 = *(double *)((long)local_28 + 0x28);
  dVar1 = *(double *)((long)local_28 + 0x30);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  GetNodeN((ChHexahedronFace *)&local_28,i);
  dVar2 = *(double *)((long)local_28 + 0x20);
  dVar3 = *(double *)((long)local_28 + 0x28);
  dVar4 = *(double *)((long)local_28 + 0x30);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  GetNodeN((ChHexahedronFace *)&local_28,i);
  dVar5 = *(double *)((long)local_28 + 0x20);
  dVar6 = *(double *)((long)local_28 + 0x28);
  dVar7 = *(double *)((long)local_28 + 0x30);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  dVar3 = dVar3 - dVar17;
  dVar4 = dVar4 - dVar1;
  dVar6 = dVar6 - dVar17;
  dVar2 = dVar2 - dVar9;
  dVar5 = dVar5 - dVar9;
  dVar7 = dVar7 - dVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar7;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar6 * dVar4;
  auVar12 = vfmsub231sd_fma(auVar20,auVar12,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar7 * dVar2;
  auVar11 = vfmsub231sd_fma(auVar19,auVar15,auVar14);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar5 * dVar3;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6;
  auVar10 = vfmsub231sd_fma(auVar13,auVar10,auVar16);
  dVar17 = auVar11._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar17 * dVar17;
  auVar11 = vfmadd231sd_fma(auVar11,auVar12,auVar12);
  auVar11 = vfmadd231sd_fma(auVar11,auVar10,auVar10);
  auVar11 = vsqrtsd_avx(auVar11,auVar11);
  bVar8 = 2.2250738585072014e-308 <= auVar11._0_8_;
  dVar9 = 1.0 / auVar11._0_8_;
  __return_storage_ptr__->m_data[0] =
       (double)((ulong)bVar8 * (long)(auVar12._0_8_ * dVar9) + (ulong)!bVar8 * 0x3ff0000000000000);
  __return_storage_ptr__->m_data[1] = (double)((ulong)bVar8 * (long)(dVar17 * dVar9));
  __return_storage_ptr__->m_data[2] = (double)((ulong)bVar8 * (long)(auVar10._0_8_ * dVar9));
  return __return_storage_ptr__;
}

Assistant:

virtual ChVector<> ComputeNormal(const double U, const double V) override {
        ChVector<> p0 = GetNodeN(0)->GetPos();
        ChVector<> p1 = GetNodeN(1)->GetPos();
        ChVector<> p2 = GetNodeN(2)->GetPos();
        return Vcross(p1 - p0, p2 - p0).GetNormalized();
    }